

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O0

int mp_abs(mp_int *a,mp_int *b)

{
  int iVar1;
  mp_int *in_RSI;
  mp_int *in_RDI;
  int res;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if ((in_RDI == in_RSI) ||
     (iVar1 = mp_copy((mp_int *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI
                     ), iVar1 == 0)) {
    in_RSI->sign = 0;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int mp_abs (mp_int * a, mp_int * b)
{
  int     res;

  /* copy a to b */
  if (a != b) {
     if ((res = mp_copy (a, b)) != MP_OKAY) {
       return res;
     }
  }

  /* force the sign of b to positive */
  b->sign = MP_ZPOS;

  return MP_OKAY;
}